

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O0

int cfg_validate_tokens(autobuf *out,char *section_name,char *entry_name,char *value,
                       cfg_schema_entry *entries,size_t entry_count,
                       cfg_schema_token_customizer *custom)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint local_184;
  ulong local_180;
  size_t i;
  uint32_t optional;
  uint32_t parameter_count;
  char *ptr;
  char section_name_entry [32];
  char buffer [256];
  size_t entry_count_local;
  cfg_schema_entry *entries_local;
  char *value_local;
  char *entry_name_local;
  char *section_name_local;
  autobuf *out_local;
  
  if (custom == (cfg_schema_token_customizer *)0x0) {
    local_184 = 0;
  }
  else {
    local_184 = custom->optional;
  }
  sVar3 = str_countwords(value);
  iVar2 = (int)sVar3;
  if ((sVar3 & 0xffffffff) < entry_count - local_184) {
    cfg_append_printable_line
              (out,
               "Missing token for entry \'%s\' in section %s. At least %zu tokens expected. Tokens must be separated by whitespaces."
               ,entry_name,section_name,entry_count);
    out_local._4_4_ = -1;
  }
  else {
    snprintf((char *)&ptr,0x20,"%s.%s",section_name,entry_name);
    _optional = value;
    for (local_180 = 0; local_180 < iVar2 - 1; local_180 = local_180 + 1) {
      _optional = str_cpynextword(section_name_entry + 0x18,_optional,0x100);
      iVar1 = (*entries[local_180].cb_validate)
                        (entries + local_180,(char *)&ptr,section_name_entry + 0x18,out);
      if (iVar1 != 0) {
        return -1;
      }
    }
    iVar2 = (*entries[iVar2 - 1].cb_validate)(entries + (iVar2 - 1),(char *)&ptr,_optional,out);
    if (iVar2 == 0) {
      if ((custom == (cfg_schema_token_customizer *)0x0) ||
         (custom->cb_validator ==
          (_func_int_autobuf_ptr_char_ptr_char_ptr_char_ptr_cfg_schema_entry_ptr_size_t *)0x0)) {
        out_local._4_4_ = 0;
      }
      else {
        out_local._4_4_ =
             (*custom->cb_validator)(out,section_name,entry_name,value,entries,entry_count);
      }
    }
    else {
      out_local._4_4_ = -1;
    }
  }
  return out_local._4_4_;
}

Assistant:

int
cfg_validate_tokens(struct autobuf *out, const char *section_name, const char *entry_name, const char *value,
  struct cfg_schema_entry *entries, size_t entry_count, struct cfg_schema_token_customizer *custom) {
  char buffer[256];
  char section_name_entry[32];
  const char *ptr;
  uint32_t parameter_count, optional;
  size_t i;

  optional = custom != NULL ? custom->optional : 0;

  parameter_count = str_countwords(value);
  if (parameter_count < entry_count - optional) {
    cfg_append_printable_line(out,
      "Missing token for entry '%s'"
      " in section %s. At least %" PRINTF_SIZE_T_SPECIFIER " tokens"
      " expected. Tokens must be separated by whitespaces.",
      entry_name, section_name, entry_count);
    return -1;
  }
  snprintf(section_name_entry, sizeof(section_name_entry), "%s.%s", section_name, entry_name);

  /* check each token */
  ptr = value;
  for (i = 0; i < parameter_count-1; i++) {
    ptr = str_cpynextword(buffer, ptr, sizeof(buffer));

    /* see if token is valid */
    if (entries[i].cb_validate(&entries[i], section_name_entry, buffer, out)) {
      return -1;
    }
  }

  /* see if the rest of the value is a valid "last" token */
  if (entries[parameter_count - 1].cb_validate(&entries[parameter_count - 1], section_name_entry, ptr, out)) {
    return -1;
  }

  if (custom && custom->cb_validator) {
    return custom->cb_validator(out, section_name, entry_name, value, entries, entry_count);
  }
  return 0;
}